

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring64_bitmap_t * roaring64_bitmap_frozen_view(char *buf,size_t maxbytes)

{
  ushort *puVar1;
  uint64_t uVar2;
  long lVar3;
  long lVar4;
  art_ref_t ref;
  ulong uVar5;
  array_container_t *c;
  roaring64_bitmap_t *r;
  container_t **ppcVar6;
  size_t sVar7;
  undefined4 *puVar8;
  ulong uVar9;
  char *buf_00;
  undefined4 uVar10;
  long lVar11;
  ushort *puVar12;
  ulong uVar13;
  size_t maxbytes_00;
  art_iterator_t it;
  ulong local_c8;
  art_iterator_t local_c0;
  
  if (((ulong)buf & 0x3f) == 0 && buf != (char *)0x0) {
    r = (roaring64_bitmap_t *)(*global_memory_hook.malloc)(0xb8);
    (r->art).root = 0;
    (r->art).first_free[0] = 0;
    (r->art).first_free[1] = 0;
    (r->art).first_free[2] = 0;
    (r->art).first_free[3] = 0;
    (r->art).first_free[4] = 0;
    (r->art).first_free[5] = 0;
    (r->art).capacities[0] = 0;
    (r->art).capacities[1] = 0;
    (r->art).capacities[2] = 0;
    (r->art).capacities[3] = 0;
    (r->art).capacities[4] = 0;
    (r->art).capacities[5] = 0;
    (r->art).nodes[1] = (art_node_t *)0x0;
    (r->art).nodes[2] = (art_node_t *)0x0;
    (r->art).nodes[3] = (art_node_t *)0x0;
    (r->art).nodes[4] = (art_node_t *)0x0;
    *(undefined8 *)((long)(r->art).nodes + 0x21) = 0;
    *(undefined8 *)((long)(r->art).nodes + 0x29) = 0;
    r->first_free = 0;
    r->capacity = 0;
    r->containers = (container_t **)0x0;
    if ((maxbytes != 0) && (r->flags = *buf | 2, 8 < maxbytes)) {
      uVar2 = *(uint64_t *)(buf + 1);
      r->capacity = uVar2;
      ppcVar6 = (container_t **)(*global_memory_hook.malloc)(uVar2 << 3);
      r->containers = ppcVar6;
      uVar2 = r->capacity;
      uVar13 = (maxbytes - 9) + uVar2 * -2;
      if ((uVar2 * 2 <= maxbytes - 9) && (0x17 < uVar13)) {
        puVar12 = (ushort *)(buf + 9);
        puVar1 = puVar12 + uVar2;
        lVar11 = *(long *)puVar1;
        lVar3 = *(long *)(puVar1 + 4);
        lVar4 = *(long *)(puVar1 + 8);
        maxbytes_00 = uVar13 - 0x18;
        buf_00 = (char *)((long)puVar1 + 0x1fU & 0xfffffffffffffff8);
        sVar7 = art_frozen_view(buf_00,maxbytes_00,(art_t *)r);
        if (sVar7 != 0) {
          local_c8 = (ulong)(buf_00 + sVar7 + 0x3f) & 0xffffffffffffffc0;
          uVar13 = local_c8 + lVar11 + 1 & 0xfffffffffffffffe;
          uVar9 = uVar13 + lVar3 + 1 & 0xfffffffffffffffe;
          if ((lVar4 + uVar9) - (long)(buf_00 + sVar7) <= maxbytes_00 - sVar7) {
            memset(&local_c0,0,0x90);
            ref = (r->art).root;
            if (ref == 0) {
              return r;
            }
            local_c0.art = (art_t *)r;
            art_node_init_iterator(ref,&local_c0,true);
            while (local_c0.value != (ulong *)0x0) {
              uVar5 = *local_c0.value;
              lVar11 = (ulong)*puVar12 + 1;
              puVar8 = (undefined4 *)(*global_memory_hook.malloc)(0x10);
              uVar10 = (undefined4)lVar11;
              *puVar8 = uVar10;
              if ((char)uVar5 == '\x03') {
                puVar8[1] = uVar10;
                *(ulong *)(puVar8 + 2) = uVar13;
                uVar13 = uVar13 + lVar11 * 4;
              }
              else if (((uint)uVar5 & 0xff) == 2) {
                puVar8[1] = uVar10;
                *(ulong *)(puVar8 + 2) = uVar9;
                uVar9 = uVar9 + lVar11 * 2;
              }
              else {
                *(ulong *)(puVar8 + 2) = local_c8;
                local_c8 = local_c8 + 0x2000;
              }
              r->containers[uVar5 >> 8] = puVar8;
              art_iterator_move(&local_c0,true);
              puVar12 = puVar12 + 1;
            }
            return r;
          }
        }
      }
    }
    roaring64_bitmap_free(r);
  }
  return (roaring64_bitmap_t *)0x0;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_frozen_view(const char *buf,
                                                 size_t maxbytes) {
    if (buf == NULL) {
        return NULL;
    }
    if ((uintptr_t)buf % CROARING_BITSET_ALIGNMENT != 0) {
        return NULL;
    }

    roaring64_bitmap_t *r = roaring64_bitmap_create();

    // Flags.
    if (maxbytes < sizeof(r->flags)) {
        roaring64_bitmap_free(r);
        return NULL;
    }
    memcpy(&r->flags, buf, sizeof(r->flags));
    buf += sizeof(r->flags);
    maxbytes -= sizeof(r->flags);
    r->flags |= ROARING_FLAG_FROZEN;

    // Container count.
    if (maxbytes < sizeof(r->capacity)) {
        roaring64_bitmap_free(r);
        return NULL;
    }
    memcpy(&r->capacity, buf, sizeof(r->capacity));
    buf += sizeof(r->capacity);
    maxbytes -= sizeof(r->capacity);

    r->containers =
        (container_t *)roaring_malloc(r->capacity * sizeof(container_t *));

    // Container element counts.
    if (maxbytes < r->capacity * sizeof(uint16_t)) {
        roaring64_bitmap_free(r);
        return NULL;
    }
    const char *elem_counts = buf;
    buf += r->capacity * sizeof(uint16_t);
    maxbytes -= r->capacity * sizeof(uint16_t);

    // Total container sizes.
    uint64_t total_sizes[4];
    if (maxbytes < sizeof(uint64_t) * 3) {
        roaring64_bitmap_free(r);
        return NULL;
    }
    memcpy(&(total_sizes[BITSET_CONTAINER_TYPE]), buf, sizeof(uint64_t));
    buf += sizeof(uint64_t);
    maxbytes -= sizeof(uint64_t);
    memcpy(&(total_sizes[RUN_CONTAINER_TYPE]), buf, sizeof(uint64_t));
    buf += sizeof(uint64_t);
    maxbytes -= sizeof(uint64_t);
    memcpy(&(total_sizes[ARRAY_CONTAINER_TYPE]), buf, sizeof(uint64_t));
    buf += sizeof(uint64_t);
    maxbytes -= sizeof(uint64_t);

    // ART (8 byte aligned).
    buf = CROARING_ALIGN_BUF(buf, 8);
    size_t art_size = art_frozen_view(buf, maxbytes, &r->art);
    if (art_size == 0) {
        roaring64_bitmap_free(r);
        return NULL;
    }
    buf += art_size;
    maxbytes -= art_size;

    // Containers (aligned).
    const char *before_containers = buf;
    buf = CROARING_ALIGN_BUF(buf, CROARING_BITSET_ALIGNMENT);
    const uint64_t *bitsets = (const uint64_t *)buf;
    buf += total_sizes[BITSET_CONTAINER_TYPE];
    buf = CROARING_ALIGN_BUF(buf, alignof(rle16_t));
    const rle16_t *runs = (const rle16_t *)buf;
    buf += total_sizes[RUN_CONTAINER_TYPE];
    buf = CROARING_ALIGN_BUF(buf, alignof(uint16_t));
    const uint16_t *arrays = (const uint16_t *)buf;
    buf += total_sizes[ARRAY_CONTAINER_TYPE];
    if (maxbytes < (uint64_t)(buf - before_containers)) {
        roaring64_bitmap_free(r);
        return NULL;
    }
    maxbytes -= buf - before_containers;

    // Deserialize in ART iteration order.
    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    for (size_t i = 0; it.value != NULL; ++i) {
        leaf_t leaf = (leaf_t)*it.value;
        uint8_t typecode = get_typecode(leaf);

        uint16_t compressed_elem_count;
        memcpy(&compressed_elem_count, elem_counts + (i * sizeof(uint16_t)),
               sizeof(compressed_elem_count));
        uint32_t elem_count = (uint32_t)(compressed_elem_count) + 1;

        // The container index is unrelated to the iteration order.
        uint64_t index = get_index(leaf);
        r->containers[index] = container_frozen_view(typecode, elem_count,
                                                     &bitsets, &arrays, &runs);

        art_iterator_next(&it);
    }

    // Padding to make overall size a multiple of required alignment.
    buf = CROARING_ALIGN_BUF(buf, CROARING_BITSET_ALIGNMENT);

    return r;
}